

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

bool __thiscall
wasm::ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::ArrayNewElem*,wasm::Type>
          (ValidationInfo *this,Type left,Type right,ArrayNewElem *curr,char *text,Function *func)

{
  char *pcVar1;
  ostream *poVar2;
  size_t sVar3;
  ostringstream local_1e0 [8];
  ostringstream ss;
  ios_base local_170 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char *local_48;
  ArrayNewElem *local_40;
  ValidationInfo *local_38;
  
  if (left.id != right.id && left.id != 1) {
    local_48 = text;
    local_40 = curr;
    local_38 = this;
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    poVar2 = wasm::operator<<((ostream *)local_1e0,left);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
    poVar2 = wasm::operator<<(poVar2,right);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
    pcVar1 = local_48;
    if (local_48 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar1,sVar3);
    }
    std::__cxx11::stringbuf::str();
    fail<wasm::ArrayNewElem*,std::__cxx11::string>(local_38,&local_68,local_40,func);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
    std::ios_base::~ios_base(local_170);
  }
  return left.id == right.id || left.id == 1;
}

Assistant:

bool shouldBeEqualOrFirstIsUnreachable(
    S left, S right, T curr, const char* text, Function* func = nullptr) {
    if (left != Type::unreachable && left != right) {
      std::ostringstream ss;
      ss << left << " != " << right << ": " << text;
      fail(ss.str(), curr, func);
      return false;
    }
    return true;
  }